

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jsrt.cpp
# Opt level: O1

JsErrorCode
JsSerializeScriptCore
          (byte *script,size_t cb,LoadScriptFlag loadScriptFlag,BYTE *functionTable,
          int functionTableSize,uchar *buffer,uint *bufferSize,JsValueRef scriptSource)

{
  ScriptContext *scriptContext;
  Utf8SourceInfo *this;
  code *pcVar1;
  bool bVar2;
  HRESULT HVar3;
  JsrtContext *pJVar4;
  undefined4 *puVar5;
  FunctionProxy *pFVar6;
  FunctionBody *function;
  size_t sVar7;
  TempArenaAllocatorObject *tempAllocator;
  SRCINFO *srcInfo;
  SourceContextInfo *pSVar8;
  JsErrorCode JVar9;
  void *unaff_retaddr;
  undefined1 local_140 [8];
  EnterScriptObject __enterScriptObject;
  CompileScriptException se;
  SRCINFO local_b0;
  undefined1 auStack_88 [8];
  AutoNestedHandledExceptionType __autoNestedHandledExceptionType;
  JavascriptFunction *local_50;
  uchar *local_48;
  uchar *buffer_local;
  ScriptContext *pSStack_38;
  AutoNestedHandledExceptionType __autoNestedHandledExceptionType_1;
  
  se.hasLineNumberInfo = false;
  se._81_7_ = 0;
  __enterScriptObject.library = (JavascriptLibrary *)0x0;
  se.super_ScriptException.ichMin = 0;
  se.super_ScriptException.ichLim = 0;
  se.super_ScriptException.ei.wCode = 0;
  se.super_ScriptException.ei.wReserved = 0;
  se.super_ScriptException.ei._4_4_ = 0;
  se.super_ScriptException.ei.bstrSource = (BSTR)0x0;
  se.super_ScriptException.ei.bstrDescription = (BSTR)0x0;
  se.super_ScriptException.ei.bstrHelpFile = (BSTR)0x0;
  se.super_ScriptException.ei.dwHelpContext = 0;
  se.super_ScriptException.ei._36_4_ = 0;
  se.super_ScriptException.ei.pvReserved = (PVOID)0x0;
  se.super_ScriptException.ei.pfnDeferredFillIn = (_func_HRESULT_tagEXCEPINFO_ptr *)0x0;
  se.super_ScriptException.ei.scode = 0;
  se.super_ScriptException.ei._60_4_ = 0;
  se.line._0_1_ = 0;
  local_48 = buffer;
  pJVar4 = JsrtContext::GetCurrent();
  JVar9 = JsErrorNoCurrentContext;
  if (pJVar4 != (JsrtContext *)0x0) {
    pSStack_38 = (((pJVar4->javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr;
    AutoNestedHandledExceptionType::AutoNestedHandledExceptionType
              ((AutoNestedHandledExceptionType *)auStack_88,
               ExceptionType_StackOverflow|ExceptionType_OutOfMemory);
    JVar9 = JsErrorNullArgument;
    if (bufferSize != (uint *)0x0 && script != (byte *)0x0) {
      if ((ulong)*bufferSize != 0) {
        if (local_48 == (uchar *)0x0) goto LAB_00385e65;
        memset(local_48,0,(ulong)*bufferSize);
      }
      bVar2 = Js::ScriptContext::IsScriptContextInDebugMode(pSStack_38);
      if (bVar2) {
        JVar9 = JsErrorCannotSerializeDebugScript;
      }
      else {
        pSVar8 = Js::ScriptContext::GetSourceContextInfo
                           (pSStack_38,0xffffffffffffffff,(SimpleDataCacheWrapper *)0x0);
        if (pSVar8 == (SourceContextInfo *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar5 = 1;
          bVar2 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/Jsrt.cpp"
                             ,0xf0b,"(sourceContextInfo != nullptr)","sourceContextInfo != nullptr")
          ;
          if (!bVar2) goto LAB_0038679b;
          *puVar5 = 0;
        }
        pSVar8->nextLocalFunctionId = 0;
        Memory::Recycler::WBSetBit((char *)&local_b0);
        local_b0.sourceContextInfo.ptr = pSVar8;
        Memory::RecyclerWriteBarrierManager::WriteBarrier(&local_b0);
        local_b0.dlnHost = 0;
        local_b0.ulColumnHost = 0;
        local_b0.lnMinHost = 0;
        local_b0.ichMinHost = 0;
        local_b0.ichLimHost =
             (Type)(cb >> ((loadScriptFlag & LoadScriptFlag_Utf8Source) == LoadScriptFlag_None));
        local_b0.ulCharOffset = 0;
        local_b0.moduleID = 0;
        local_b0.grfsi = 0;
        pJVar4 = JsrtContext::GetCurrent();
        bVar2 = ((pJVar4->runtime).ptr)->serializeByteCodeForLibrary;
        se.bstrLine = (BSTR)0x0;
        local_50 = Js::ScriptContext::LoadScript
                             (pSStack_38,script,cb,&local_b0,
                              (CompileScriptException *)&__enterScriptObject.library,
                              (Utf8SourceInfo **)&se.bstrLine,L"Global code",
                              (uint)bVar2 + (uint)bVar2 * 2 +
                              (LoadScriptFlag_disableDeferredParse|LoadScriptFlag_Expression) |
                              loadScriptFlag,scriptSource);
        JVar9 = JsNoError;
      }
    }
LAB_00385e65:
    if ((JVar9 - JsErrorNoCurrentContext < 7) &&
       ((0x43U >> (JVar9 - JsErrorNoCurrentContext & 0x1f) & 1) != 0)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar5 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/JsrtInternal.h"
                         ,0x11f,
                         "(errCode != JsErrorFatal && errCode != JsErrorNoCurrentContext && errCode != JsErrorInExceptionState && errCode != JsErrorInDisabledState && errCode != JsErrorOutOfMemory && (scriptExceptionAllowed || errCode != JsErrorScriptException) && errCode != JsErrorScriptTerminated)"
                         ,
                         "errCode != JsErrorFatal && errCode != JsErrorNoCurrentContext && errCode != JsErrorInExceptionState && errCode != JsErrorInDisabledState && errCode != JsErrorOutOfMemory && (scriptExceptionAllowed || errCode != JsErrorScriptException) && errCode != JsErrorScriptTerminated"
                        );
      if (!bVar2) goto LAB_0038679b;
      *puVar5 = 0;
    }
    AutoNestedHandledExceptionType::~AutoNestedHandledExceptionType
              ((AutoNestedHandledExceptionType *)auStack_88);
  }
  if (JVar9 == JsNoError) {
    pJVar4 = JsrtContext::GetCurrent();
    JVar9 = JsErrorNoCurrentContext;
    if (pJVar4 != (JsrtContext *)0x0) {
      scriptContext =
           (((pJVar4->javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr;
      AutoNestedHandledExceptionType::AutoNestedHandledExceptionType
                ((AutoNestedHandledExceptionType *)((long)&buffer_local + 4),
                 ExceptionType_JavascriptException|ExceptionType_OutOfMemory);
      auStack_88 = (undefined1  [8])0x0;
      ___autoNestedHandledExceptionType = (void *)0x0;
      Js::EnterScriptObject::EnterScriptObject
                ((EnterScriptObject *)local_140,scriptContext,(ScriptEntryExitRecord *)auStack_88,
                 unaff_retaddr,&stack0x00000000,true,true,true);
      Js::ScriptContext::OnScriptStart(scriptContext,true,true);
      Js::EnterScriptObject::VerifyEnterScript((EnterScriptObject *)local_140);
      if (local_50 == (JavascriptFunction *)0x0) {
        JVar9 = JsErrorScriptCompile;
        HandleScriptCompileError
                  (scriptContext,(CompileScriptException *)&__enterScriptObject.library,(WCHAR *)0x0
                  );
      }
      else {
        if ((DAT_015b5fab == '\x01') &&
           (pFVar6 = Js::JavascriptFunction::GetFunctionProxy(local_50),
           pFVar6 != (FunctionProxy *)0x0)) {
          pFVar6 = Js::JavascriptFunction::GetFunctionProxy(local_50);
          Js::FunctionProxy::EnsureDeserialized(pFVar6);
        }
        function = Js::JavascriptFunction::GetFunctionBody(local_50);
        this = (function->super_ParseableFunctionInfo).super_FunctionProxy.m_utf8SourceInfo.ptr;
        sVar7 = Js::Utf8SourceInfo::GetCbLength(this,L"JsSerializeScript");
        JVar9 = JsErrorOutOfMemory;
        if (sVar7 >> 0x20 == 0) {
          pSStack_38 = (ScriptContext *)Js::Utf8SourceInfo::GetSource(this,L"JsSerializeScript");
          pJVar4 = JsrtContext::GetCurrent();
          bVar2 = ((pJVar4->runtime).ptr)->serializeByteCodeForLibrary;
          tempAllocator =
               Js::ScriptContext::GetTemporaryAllocator(scriptContext,L"ByteCodeSerializer");
          srcInfo = Js::FunctionProxy::GetHostSrcInfo((FunctionProxy *)function);
          HVar3 = Js::ByteCodeSerializer::SerializeToBuffer
                            (scriptContext,&tempAllocator->allocator,(DWORD)sVar7,
                             (LPCUTF8)pSStack_38,function,srcInfo,&local_48,bufferSize,(uint)bVar2);
          Js::ScriptContext::ReleaseTemporaryAllocator(scriptContext,tempAllocator);
          JVar9 = HVar3 >> 0x1f & JsErrorScriptCompile;
        }
      }
      Js::EnterScriptObject::~EnterScriptObject((EnterScriptObject *)local_140);
      if ((JVar9 & 0x20003) == JsErrorOutOfMemory) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar5 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/JsrtInternal.h"
                           ,0xcc,
                           "(errCode != JsErrorFatal && errCode != JsErrorNoCurrentContext && errCode != JsErrorInExceptionState && errCode != JsErrorInDisabledState && errCode != JsErrorOutOfMemory && errCode != JsErrorScriptException && errCode != JsErrorScriptTerminated)"
                           ,
                           "errCode != JsErrorFatal && errCode != JsErrorNoCurrentContext && errCode != JsErrorInExceptionState && errCode != JsErrorInDisabledState && errCode != JsErrorOutOfMemory && errCode != JsErrorScriptException && errCode != JsErrorScriptTerminated"
                          );
        if (!bVar2) {
LAB_0038679b:
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        *puVar5 = 0;
      }
      AutoNestedHandledExceptionType::~AutoNestedHandledExceptionType
                ((AutoNestedHandledExceptionType *)((long)&buffer_local + 4));
    }
  }
  CompileScriptException::~CompileScriptException
            ((CompileScriptException *)&__enterScriptObject.library);
  return JVar9;
}

Assistant:

JsErrorCode JsSerializeScriptCore(const byte *script, size_t cb,
    LoadScriptFlag loadScriptFlag, BYTE *functionTable, int functionTableSize,
    unsigned char *buffer, unsigned int *bufferSize, JsValueRef scriptSource)
{
    Js::JavascriptFunction *function;
    CompileScriptException se;

    JsErrorCode errorCode = ContextAPINoScriptWrapper_NoRecord([&](Js::ScriptContext *scriptContext) -> JsErrorCode {
        PARAM_NOT_NULL(script);
        PARAM_NOT_NULL(bufferSize);

        if (*bufferSize > 0)
        {
            PARAM_NOT_NULL(buffer);
            ZeroMemory(buffer, *bufferSize);
        }

        if (scriptContext->IsScriptContextInDebugMode())
        {
            return JsErrorCannotSerializeDebugScript;
        }

        SourceContextInfo * sourceContextInfo = scriptContext->GetSourceContextInfo(JS_SOURCE_CONTEXT_NONE, nullptr);
        Assert(sourceContextInfo != nullptr);
        sourceContextInfo->nextLocalFunctionId = 0;

        const int chsize = (loadScriptFlag & LoadScriptFlag_Utf8Source) ? sizeof(utf8char_t) : sizeof(WCHAR);
        SRCINFO si = {
            /* sourceContextInfo   */ sourceContextInfo,
            /* dlnHost             */ 0,
            /* ulColumnHost        */ 0,
            /* lnMinHost           */ 0,
            /* ichMinHost          */ 0,
            /* ichLimHost          */ static_cast<ULONG>(cb / chsize), // OK to truncate since this is used to limit sourceText in debugDocument/compilation errors.
            /* ulCharOffset        */ 0,
            /* mod                 */ kmodGlobal,
            /* grfsi               */ 0
        };
        bool isSerializeByteCodeForLibrary = false;
#ifdef ENABLE_DEBUG_CONFIG_OPTIONS
        isSerializeByteCodeForLibrary = JsrtContext::GetCurrent()->GetRuntime()->IsSerializeByteCodeForLibrary();
#endif

        Js::Utf8SourceInfo* sourceInfo = nullptr;
        loadScriptFlag = (LoadScriptFlag)(loadScriptFlag | LoadScriptFlag_disableDeferredParse);
        if (isSerializeByteCodeForLibrary)
        {
            loadScriptFlag = (LoadScriptFlag)(loadScriptFlag | LoadScriptFlag_isByteCodeBufferForLibrary);
        }
        else
        {
            loadScriptFlag = (LoadScriptFlag)(loadScriptFlag | LoadScriptFlag_Expression);
        }
        function = scriptContext->LoadScript(script, cb, &si, &se, &sourceInfo,
            Js::Constants::GlobalCode, loadScriptFlag, scriptSource);
        return JsNoError;
    });

    if (errorCode != JsNoError)
    {
        return errorCode;
    }

    return ContextAPIWrapper_NoRecord<false>([&](Js::ScriptContext* scriptContext) -> JsErrorCode {
        if (function == nullptr)
        {
            HandleScriptCompileError(scriptContext, &se);
            return JsErrorScriptCompile;
        }
        // Could we have a deserialized function in this case?
        // If we are going to serialize it, a check isn't to expensive
        if (CONFIG_FLAG(ForceSerialized) && function->GetFunctionProxy() != nullptr) {
            function->GetFunctionProxy()->EnsureDeserialized();
        }
        Js::FunctionBody *functionBody = function->GetFunctionBody();
        const Js::Utf8SourceInfo *sourceInfo = functionBody->GetUtf8SourceInfo();
        size_t cSourceCodeLength = sourceInfo->GetCbLength(_u("JsSerializeScript"));

        // truncation of code length can lead to accessing random memory. Reject the call.
        if (cSourceCodeLength > DWORD_MAX)
        {
            return JsErrorOutOfMemory;
        }

        LPCUTF8 utf8Code = sourceInfo->GetSource(_u("JsSerializeScript"));
        DWORD dwFlags = 0;
#ifdef ENABLE_DEBUG_CONFIG_OPTIONS
        dwFlags = JsrtContext::GetCurrent()->GetRuntime()->IsSerializeByteCodeForLibrary() ? GENERATE_BYTE_CODE_BUFFER_LIBRARY : 0;
#endif

        BEGIN_TEMP_ALLOCATOR(tempAllocator, scriptContext, _u("ByteCodeSerializer"));
        // We cast buffer size to DWORD* because on Windows, DWORD = unsigned long = unsigned int
        // On 64-bit clang on linux, this is not true, unsigned long is larger than unsigned int
        // However, the PAL defines DWORD for us on linux as unsigned int so the cast is safe here.
        HRESULT hr = Js::ByteCodeSerializer::SerializeToBuffer(scriptContext,
            tempAllocator, static_cast<DWORD>(cSourceCodeLength), utf8Code,
            functionBody, functionBody->GetHostSrcInfo(), &buffer,
            (DWORD*) bufferSize, dwFlags);
        END_TEMP_ALLOCATOR(tempAllocator, scriptContext);

        if (SUCCEEDED(hr))
        {
            return JsNoError;
        }
        else
        {
            return JsErrorScriptCompile;
        }
    });
}